

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PreprocessorTests.cpp
# Opt level: O2

TokenKind lexUnconnectedDrive(string_view text)

{
  SourceManager *sourceManager;
  StringRef macroName;
  string_view name;
  StringRef capturedExpression;
  Token token;
  AssertionHandler catchAssertionHandler;
  SourceLineInfo local_3d0;
  Preprocessor preprocessor;
  
  slang::SmallVectorBase<slang::Diagnostic>::clear
            ((SmallVectorBase<slang::Diagnostic> *)&slang::diagnostics);
  sourceManager = getSourceManager();
  catchAssertionHandler.m_assertionInfo.capturedExpression.m_start = (char *)0x0;
  catchAssertionHandler.m_assertionInfo.capturedExpression.m_size = 0;
  catchAssertionHandler.m_assertionInfo.lineInfo.file = (char *)0x0;
  catchAssertionHandler.m_assertionInfo.lineInfo.line = 0;
  catchAssertionHandler.m_assertionInfo.macroName.m_start = (char *)0x0;
  catchAssertionHandler.m_assertionInfo.macroName.m_size = 0;
  boost::unordered::
  unordered_flat_map<std::type_index,_std::any,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
  ::unordered_flat_map
            ((unordered_flat_map<std::type_index,_std::any,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
              *)&catchAssertionHandler);
  slang::parsing::Preprocessor::Preprocessor
            (&preprocessor,sourceManager,(BumpAllocator *)slang::alloc,
             (Diagnostics *)&slang::diagnostics,(Bag *)&catchAssertionHandler,
             (span<const_slang::syntax::DefineDirectiveSyntax_*const,_18446744073709551615UL>)
             ZEXT816(0));
  boost::unordered::detail::foa::
  table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
  ::~table_core((table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
                 *)&catchAssertionHandler);
  name._M_str = "source";
  name._M_len = 6;
  slang::parsing::Preprocessor::pushSource(&preprocessor,text,name);
  token = slang::parsing::Preprocessor::next(&preprocessor);
  local_3d0.file =
       "/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/tests/unittests/parsing/PreprocessorTests.cpp"
  ;
  local_3d0.line = 0x52d;
  macroName.m_size = 7;
  macroName.m_start = "REQUIRE";
  capturedExpression.m_size = 5;
  capturedExpression.m_start = "token";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName,&local_3d0,capturedExpression,Normal);
  local_3d0.file = (char *)&token;
  Catch::AssertionHandler::handleExpr<slang::parsing::Token&>
            (&catchAssertionHandler,(ExprLhs<slang::parsing::Token_&> *)&local_3d0);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  slang::parsing::Preprocessor::~Preprocessor(&preprocessor);
  return preprocessor.unconnectedDrive;
}

Assistant:

TokenKind lexUnconnectedDrive(std::string_view text) {
    diagnostics.clear();

    Preprocessor preprocessor(getSourceManager(), alloc, diagnostics);
    preprocessor.pushSource(text);

    Token token = preprocessor.next();
    REQUIRE(token);
    return preprocessor.getUnconnectedDrive();
}